

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::BeginElemSegment
          (BinaryReaderIR *this,Index index,Index table_index,uint8_t flags)

{
  ElemSegmentModuleField *pEVar1;
  SegmentKind SVar2;
  pointer *__ptr;
  ElemSegmentModuleField *local_a8;
  _Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false> local_a0;
  Location local_98;
  Var local_78;
  
  GetLocation(&local_78.loc,this);
  MakeUnique<wabt::ElemSegmentModuleField,wabt::Location>((wabt *)&local_a8,&local_78.loc);
  pEVar1 = local_a8;
  GetLocation(&local_98,this);
  Var::Var(&local_78,table_index,&local_98);
  Var::operator=(&(pEVar1->elem_segment).table_var,&local_78);
  Var::~Var(&local_78);
  SVar2 = Declared;
  if ((~(uint)flags & 3) != 0) {
    SVar2 = flags & Passive;
  }
  (pEVar1->elem_segment).kind = SVar2;
  local_a0._M_head_impl = local_a8;
  local_a8 = (ElemSegmentModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                       *)&local_a0);
  if (local_a0._M_head_impl != (ElemSegmentModuleField *)0x0) {
    (*((local_a0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_a0._M_head_impl = (ElemSegmentModuleField *)0x0;
  if (local_a8 != (ElemSegmentModuleField *)0x0) {
    (**(code **)(*(long *)local_a8 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::BeginElemSegment(Index index,
                                        Index table_index,
                                        uint8_t flags) {
  auto field = MakeUnique<ElemSegmentModuleField>(GetLocation());
  ElemSegment& elem_segment = field->elem_segment;
  elem_segment.table_var = Var(table_index, GetLocation());
  if ((flags & SegDeclared) == SegDeclared) {
    elem_segment.kind = SegmentKind::Declared;
  } else if ((flags & SegPassive) == SegPassive) {
    elem_segment.kind = SegmentKind::Passive;
  } else {
    elem_segment.kind = SegmentKind::Active;
  }
  module_->AppendField(std::move(field));
  return Result::Ok;
}